

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_bc7enc.cpp
# Opt level: O2

uint64_t basisu::color_cell_compression
                   (uint32_t mode,color_cell_compressor_params *pParams,
                   color_cell_compressor_results *pResults,
                   bc7enc_compress_block_params *pComp_params)

{
  byte bVar1;
  color_quad_u8 *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  color_quad_u8 *pcVar8;
  uint32_t i;
  int iVar9;
  bc7enc_vec4F *pbVar10;
  ulong uVar11;
  uint64_t uVar12;
  ulong uVar13;
  char cVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  int hy;
  uint uVar18;
  uint uVar19;
  int iVar20;
  bool bVar21;
  float fVar22;
  undefined8 uVar23;
  float fVar29;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  float fVar30;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar28 [16];
  float fVar31;
  float fVar32;
  float fVar37;
  undefined8 in_XMM1_Qb;
  float fVar38;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar48;
  float fVar51;
  float fVar53;
  undefined1 auVar49 [16];
  float fVar52;
  float fVar54;
  undefined1 auVar50 [16];
  float fVar55;
  undefined4 uVar56;
  float fVar57;
  undefined1 auVar58 [16];
  float afVar59 [4];
  undefined1 auVar60 [16];
  bc7enc_vec4F bVar61;
  bc7enc_vec4F xl;
  bc7enc_vec4F xl_00;
  bc7enc_vec4F xl_01;
  bc7enc_vec4F xl_02;
  bc7enc_vec4F xl_03;
  bc7enc_vec4F xh;
  bc7enc_vec4F xh_00;
  bc7enc_vec4F xh_01;
  bc7enc_vec4F xh_02;
  bc7enc_vec4F xh_03;
  bc7enc_vec4F xh_04;
  uint32_t cb;
  uint32_t cg;
  uint32_t cr;
  uint32_t local_19c;
  bc7enc_vec4F local_198;
  bc7enc_vec4F local_188;
  bc7enc_vec4F local_178;
  uint8_t selectors_temp1 [16];
  uint8_t selectors_temp [16];
  uint32_t local_148 [2];
  uint8_t *puStack_140;
  uint8_t *local_138;
  color_quad_u8 cStack_130;
  color_quad_u8 cStack_12c;
  bc7enc_vec4F local_128;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [8];
  undefined8 uStack_100;
  undefined8 local_f8;
  float fStack_f0;
  float fStack_ec;
  bc7enc_compress_block_params *local_e0;
  bc7enc_vec4F c0;
  float local_c8;
  float fStack_c4;
  bc7enc_vec4F c1;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar35 [16];
  
  local_19c = mode;
  local_e0 = pComp_params;
  if (((mode != 6) && (pParams->m_astc_endpoint_range == 0)) && (pParams->m_has_alpha != '\0')) {
    __assert_fail("(mode == 6) || (!pParams->m_has_alpha)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x55e,
                  "uint64_t basisu::color_cell_compression(uint32_t, const color_cell_compressor_params *, color_cell_compressor_results *, const bc7enc_compress_block_params *)"
                 );
  }
  if (0x1f < pParams->m_num_selector_weights - 1) {
    __assert_fail("pParams->m_num_selector_weights >= 1 && pParams->m_num_selector_weights <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x560,
                  "uint64_t basisu::color_cell_compression(uint32_t, const color_cell_compressor_params *, color_cell_compressor_results *, const bc7enc_compress_block_params *)"
                 );
  }
  if (*pParams->m_pSelector_weights != 0) {
    __assert_fail("pParams->m_pSelector_weights[0] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x561,
                  "uint64_t basisu::color_cell_compression(uint32_t, const color_cell_compressor_params *, color_cell_compressor_results *, const bc7enc_compress_block_params *)"
                 );
  }
  if (pParams->m_pSelector_weights[(ulong)pParams->m_num_selector_weights - 1] != 0x40) {
    __assert_fail("pParams->m_pSelector_weights[pParams->m_num_selector_weights - 1] == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x562,
                  "uint64_t basisu::color_cell_compression(uint32_t, const color_cell_compressor_params *, color_cell_compressor_results *, const bc7enc_compress_block_params *)"
                 );
  }
  pResults->m_best_overall_err = 0xffffffffffffffff;
  if (pParams->m_pForce_selectors == (uint8_t *)0x0) {
    if (mode == 1) {
      bVar21 = is_solid_rgb(pParams,&cr,&cg,&cb);
      if (bVar21) {
        uVar12 = pack_mode1_to_one_color(pParams,pResults,cr,cg,cb,pResults->m_pSelectors);
        return uVar12;
      }
    }
    else {
      switch(pParams->m_astc_endpoint_range) {
      case 7:
        if (((pParams->m_num_selector_weights == 4) && (pParams->m_has_alpha == '\0')) &&
           (bVar21 = is_solid_rgb(pParams,&cr,&cg,&cb), bVar21)) {
          uVar12 = pack_astc_range7_2bit_to_one_color
                             (pParams,pResults,cr,cg,cb,pResults->m_pSelectors);
          return uVar12;
        }
        break;
      case 8:
        if (pParams->m_num_selector_weights == 4) {
          if (pParams->m_has_alpha != '\0') {
            pcVar2 = pParams->m_pPixels;
            cr = (uint32_t)pcVar2->m_c[0];
            cg = (uint32_t)pcVar2->m_c[1];
            cb = (uint32_t)pcVar2->m_c[2];
            uVar13 = 1;
            do {
              if (pParams->m_num_pixels <= uVar13) {
                uVar12 = pack_astc_4bit_2bit_to_one_color_rgba
                                   (pParams,pResults,cr,cg,cb,(uint)pcVar2->m_c[3],
                                    pResults->m_pSelectors);
                return uVar12;
              }
            } while ((((pcVar2->m_c[0] == pcVar2[uVar13].m_c[0]) &&
                      (pcVar2->m_c[1] == pcVar2[uVar13].m_c[1])) &&
                     (pcVar2->m_c[2] == pcVar2[uVar13].m_c[2])) &&
                    (pcVar8 = pcVar2 + uVar13, uVar13 = uVar13 + 1, pcVar2->m_c[3] == pcVar8->m_c[3]
                    ));
          }
        }
        else if (((pParams->m_num_selector_weights == 8) && (pParams->m_has_alpha == '\0')) &&
                (bVar21 = is_solid_rgb(pParams,&cr,&cg,&cb), bVar21)) {
          uVar12 = pack_astc_4bit_3bit_to_one_color
                             (pParams,pResults,cr,cg,cb,pResults->m_pSelectors);
          return uVar12;
        }
        break;
      case 0xb:
        if (((pParams->m_num_selector_weights == 0x20) && (pParams->m_has_alpha == '\0')) &&
           (bVar21 = is_solid_rgb(pParams,&cr,&cg,&cb), bVar21)) {
          uVar12 = pack_astc_range11_5bit_to_one_color
                             (pParams,pResults,cr,cg,cb,pResults->m_pSelectors);
          return uVar12;
        }
        break;
      case 0xd:
        if (((pParams->m_num_selector_weights == 4) && (pParams->m_has_alpha == '\0')) &&
           (bVar21 = is_solid_rgb(pParams,&cr,&cg,&cb), bVar21)) {
          uVar12 = pack_astc_range13_2bit_to_one_color
                             (pParams,pResults,cr,cg,cb,pResults->m_pSelectors);
          return uVar12;
        }
      }
    }
  }
  uVar13 = (ulong)pParams->m_num_pixels;
  _local_108 = ZEXT816(0);
  fVar47 = 0.0;
  fVar51 = 0.0;
  fStack_110 = 0.0;
  fStack_10c = 0.0;
  for (lVar17 = 0; uVar13 * 4 - lVar17 != 0; lVar17 = lVar17 + 4) {
    local_118 = fVar47;
    fStack_114 = fVar51;
    bVar61 = vec4F_from_color((color_quad_u8 *)(pParams->m_pPixels->m_c + lVar17));
    fVar47 = local_118 + bVar61.m_c[0];
    fVar51 = fStack_114 + bVar61.m_c[1];
    fStack_110 = fStack_110 + (float)extraout_XMM0_Qb;
    fStack_10c = fStack_10c + (float)((ulong)extraout_XMM0_Qb >> 0x20);
    local_198.m_c[2] = (float)local_108._0_4_ + bVar61.m_c[2];
    local_198.m_c[3] = (float)local_108._4_4_ + bVar61.m_c[3];
    _local_108 = CONCAT412(uStack_100._4_4_ + (float)((ulong)in_XMM1_Qb >> 0x20),
                           CONCAT48((float)uStack_100 + (float)in_XMM1_Qb,
                                    CONCAT44(local_198.m_c[3],local_198.m_c[2])));
    local_198.m_c[1] = fVar51;
    local_198.m_c[0] = fVar47;
  }
  fVar57 = 0.0;
  fVar31 = 1.0 / (float)uVar13;
  local_118 = fVar31 * fVar47;
  fStack_114 = fVar31 * fVar51;
  fStack_110 = fStack_110 * 0.0;
  fStack_10c = fStack_10c * 0.0;
  fVar30 = local_108._0_4_;
  fVar37 = local_108._4_4_;
  fVar38 = local_108._8_4_;
  fVar32 = local_108._12_4_;
  local_108._4_4_ = fVar31 * fVar37;
  local_108._0_4_ = fVar31 * fVar30;
  uStack_100._0_4_ = fVar38 * 0.0;
  uStack_100._4_4_ = fVar32 * 0.0;
  fVar31 = 1.0 / ((float)uVar13 * 255.0);
  fVar38 = 0.0;
  local_198.m_c[0] = fVar47 * fVar31;
  local_198.m_c[1] = fVar51 * fVar31;
  local_198.m_c[3] = fVar31 * fVar37;
  local_198.m_c[2] = fVar31 * fVar30;
  vec4F_saturate_in_place(&local_198);
  if (pParams->m_has_alpha == '\0') {
    auVar43 = ZEXT816(0);
    auVar49 = ZEXT816(0);
    uVar11 = 0;
    fVar47 = 0.0;
    auVar44 = ZEXT816(0);
    while( true ) {
      fVar37 = auVar44._0_4_;
      fVar51 = auVar43._0_4_;
      fVar32 = auVar44._4_4_;
      fVar30 = auVar43._12_4_;
      fVar29 = auVar44._12_4_;
      fVar31 = auVar43._4_4_;
      fVar22 = auVar44._8_4_;
      fVar38 = auVar43._8_4_;
      if (uVar13 == uVar11) break;
      auVar43 = ZEXT216(*(ushort *)pParams->m_pPixels[uVar11].m_c);
      fVar55 = (float)pParams->m_pPixels[uVar11].m_c[2] - (float)local_108._0_4_;
      auVar43 = pmovzxbd(auVar43,auVar43);
      fVar48 = (float)auVar43._0_4_ - local_118;
      fVar52 = (float)auVar43._4_4_ - fStack_114;
      fVar53 = (float)auVar43._8_4_ - fStack_110;
      fVar54 = (float)auVar43._12_4_ - fStack_10c;
      fVar47 = fVar47 + fVar48 * fVar48;
      auVar44._0_4_ = fVar37 + fVar52 * fVar48;
      auVar44._4_4_ = fVar32 + fVar52 * fVar52;
      auVar44._8_4_ = fVar22 + fVar54 * fVar53;
      auVar44._12_4_ = fVar29 + fVar54 * fVar54;
      auVar43._0_4_ = fVar51 + fVar55 * fVar48;
      auVar43._4_4_ = fVar31 + fVar55 * fVar52;
      auVar43._8_4_ = fVar38 + fVar57 * fVar53;
      auVar43._12_4_ = fVar30 + fVar57 * fVar54;
      auVar49._0_4_ = auVar49._0_4_ + fVar55 * fVar55;
      uVar11 = uVar11 + 1;
    }
    auVar43 = blendps(auVar49,auVar43,0xe);
    auVar49 = ZEXT816(0x3f8000003f666666);
    auVar25._0_12_ = ZEXT812(0x3f333333);
    auVar25._12_4_ = 0.0;
    iVar9 = 3;
    while( true ) {
      bVar21 = iVar9 == 0;
      iVar9 = iVar9 + -1;
      fVar48 = auVar49._0_4_;
      fVar52 = auVar49._4_4_;
      fVar53 = auVar49._8_4_;
      fVar54 = auVar49._12_4_;
      fVar57 = auVar25._0_4_;
      if (bVar21) break;
      auVar58._0_4_ = fVar57 * fVar51 + fVar52 * fVar37 + fVar48 * fVar47;
      auVar58._4_4_ = fVar57 * fVar31 + fVar52 * fVar32 + fVar48 * fVar37;
      auVar58._8_4_ = auVar25._8_4_ * fVar38 + fVar54 * fVar22 + fVar53 * fVar22;
      auVar58._12_4_ = auVar25._8_4_ * fVar30 + fVar54 * fVar29 + fVar53 * fVar22;
      auVar49 = blendps(auVar25,auVar49,0xe);
      auVar25._4_4_ = auVar49._4_4_ * auVar43._4_4_;
      auVar25._12_4_ = auVar49._12_4_ * auVar43._12_4_;
      fVar48 = auVar25._4_4_ + fVar48 * fVar51 + auVar49._0_4_ * auVar43._0_4_;
      fVar57 = ABS(auVar58._0_4_);
      if (ABS(auVar58._0_4_) <= ABS(auVar58._4_4_)) {
        fVar57 = ABS(auVar58._4_4_);
      }
      if (fVar57 <= ABS(fVar48)) {
        fVar57 = ABS(fVar48);
      }
      fVar52 = 1.0 / fVar57;
      if (1e-10 < fVar57) {
        fVar48 = fVar48 * fVar52;
      }
      auVar60._0_4_ = fVar52 * auVar58._0_4_;
      auVar60._4_4_ = fVar52 * auVar58._4_4_;
      auVar60._8_4_ = auVar58._8_4_ * 0.0;
      auVar60._12_4_ = auVar58._12_4_ * 0.0;
      auVar26._0_4_ = (uint)(1e-10 < fVar57) << 0x1f;
      auVar26._4_4_ = (uint)(1e-10 < fVar57) << 0x1f;
      auVar26._8_8_ = 0;
      auVar49 = blendvps(auVar58,auVar60,auVar26);
      auVar25._0_4_ = fVar48;
      auVar25._8_4_ = auVar25._12_4_;
    }
    fVar47 = fVar57 * fVar57 + fVar48 * fVar48 + fVar52 * fVar52;
    if (1e-10 <= fVar47) {
      fVar47 = 1.0 / SQRT(fVar47);
      afVar59 = (float  [4])
                CONCAT412(fVar54 * 0.0,
                          CONCAT48(fVar53 * 0.0,CONCAT44(fVar52 * fVar47,fVar48 * fVar47)));
      fVar57 = fVar57 * fVar47;
      local_128.m_c[2] = fVar57;
      local_128.m_c[0] = fVar48 * fVar47;
      local_128.m_c[1] = fVar52 * fVar47;
      local_128.m_c[3] = 0.0;
      fVar47 = 0.0;
    }
    else {
      afVar59 = (float  [4])ZEXT816(0);
      fVar57 = 0.0;
      fVar47 = 0.0;
      local_128.m_c = afVar59;
    }
  }
  else {
    fVar47 = 0.0;
    fVar51 = 0.0;
    fVar31 = 0.0;
    fVar30 = 0.0;
    local_128.m_c._0_12_ = ZEXT812(0);
    local_128.m_c[3] = 0.0;
    for (lVar17 = 0; fVar37 = 0.0, uVar13 * 4 - lVar17 != 0; lVar17 = lVar17 + 4) {
      local_f8 = CONCAT44(fVar51,fVar47);
      fStack_f0 = fVar31;
      fStack_ec = fVar30;
      bVar61 = vec4F_from_color((color_quad_u8 *)(pParams->m_pPixels->m_c + lVar17));
      fVar32 = bVar61.m_c[2] - (float)local_108._0_4_;
      fVar57 = bVar61.m_c[3] - (float)local_108._4_4_;
      fVar37 = fVar37 - (float)uStack_100;
      fVar38 = fVar38 - uStack_100._4_4_;
      fVar31 = bVar61.m_c[0] - local_118;
      fVar51 = bVar61.m_c[1] - fStack_114;
      fVar47 = (float)extraout_XMM0_Qb_00 - fStack_110;
      fVar30 = (float)((ulong)extraout_XMM0_Qb_00 >> 0x20) - fStack_10c;
      selectors_temp._4_4_ = fVar51;
      selectors_temp._0_4_ = fVar31;
      selectors_temp._12_4_ = fVar57;
      selectors_temp._8_4_ = fVar32;
      pbVar10 = &local_128;
      if (lVar17 == 0) {
        pbVar10 = (bc7enc_vec4F *)selectors_temp;
      }
      c0.m_c._0_8_ = *(undefined8 *)pbVar10->m_c;
      c0.m_c._8_8_ = *(undefined8 *)(pbVar10->m_c + 2);
      vec4F_normalize_in_place(&c0);
      fVar22 = c0.m_c[0];
      fVar29 = c0.m_c[1];
      auVar4._4_4_ = fVar57;
      auVar4._0_4_ = fVar32 * fVar51;
      auVar4._8_4_ = fVar37;
      auVar4._12_4_ = fVar38;
      auVar7._4_4_ = fVar51;
      auVar7._0_4_ = fVar31 * fVar51;
      auVar7._8_4_ = fVar47;
      auVar7._12_4_ = fVar30;
      auVar43 = insertps(auVar7,auVar4,0x20);
      auVar6._4_4_ = fVar51;
      auVar6._0_4_ = fVar31 * fVar57;
      auVar6._8_4_ = fVar47;
      auVar6._12_4_ = fVar30;
      auVar44 = insertps(auVar43,auVar6,0x30);
      auVar5._4_4_ = fVar51 * fVar51;
      auVar5._0_4_ = fVar31 * fVar31;
      auVar5._8_4_ = fVar31 * fVar32;
      auVar5._12_4_ = fVar51 * fVar57;
      auVar49 = insertps(auVar6,auVar5,0xdc);
      auVar24._8_8_ = auVar5._8_8_;
      auVar24._0_8_ = auVar24._8_8_;
      auVar43 = insertps(auVar24,auVar4,0x10);
      auVar43 = insertps(auVar43,fVar32 * fVar32,0x20);
      auVar3._4_4_ = fVar57;
      auVar3._0_4_ = fVar32 * fVar57;
      auVar3._8_4_ = fVar37;
      auVar3._12_4_ = fVar38;
      auVar43 = insertps(auVar43,auVar3,0x30);
      auVar49 = insertps(auVar49,auVar3,0x20);
      auVar49 = insertps(auVar49,fVar57 * fVar57,0x30);
      fVar38 = c0.m_c[3] * auVar49._12_4_ +
               c0.m_c[2] * auVar43._12_4_ + fVar29 * fVar51 * fVar57 + auVar44._12_4_ * fVar22;
      fVar47 = (float)local_f8 +
               c0.m_c[3] * auVar49._0_4_ +
               c0.m_c[2] * auVar43._0_4_ + fVar22 * fVar31 * fVar31 + auVar44._0_4_ * fVar29;
      fVar51 = local_f8._4_4_ +
               c0.m_c[3] * auVar49._4_4_ +
               c0.m_c[2] * auVar43._4_4_ + fVar29 * fVar51 * fVar51 + auVar44._0_4_ * fVar22;
      fVar31 = fStack_f0 +
               c0.m_c[3] * auVar49._8_4_ +
               c0.m_c[2] * auVar43._8_4_ + fVar22 * fVar31 * fVar32 + auVar44._8_4_ * fVar29;
      fVar30 = fStack_ec + fVar38;
      local_128.m_c[1] = fVar51;
      local_128.m_c[0] = fVar47;
      local_128.m_c[2] = fVar31;
      local_128.m_c[3] = fVar30;
    }
    vec4F_normalize_in_place(&local_128);
    bVar61.m_c = local_128.m_c;
    afVar59[2] = 0.0;
    afVar59[3] = 0.0;
    afVar59[0] = local_128.m_c[0];
    afVar59[1] = local_128.m_c[1];
    local_128.m_c[2] = bVar61.m_c[2];
    local_128.m_c[3] = bVar61.m_c[3];
    fVar57 = local_128.m_c[2];
    fVar47 = local_128.m_c[3];
    local_128.m_c = bVar61.m_c;
  }
  if (fVar47 * fVar47 + afVar59[0] * afVar59[0] + afVar59[1] * afVar59[1] + fVar57 * fVar57 < 0.5) {
    bVar21 = pParams->m_perceptual == '\0';
    uVar15 = (uint)bVar21;
    auVar27._0_4_ = uVar15 << 0x1f;
    auVar27._4_4_ = uVar15 << 0x1f;
    auVar27._8_8_ = 0;
    auVar49 = blendvps(ZEXT816(0x3d9374bc3f370a3d),_DAT_002643d0,auVar27);
    auVar43 = (undefined1  [16])0x0;
    if (pParams->m_has_alpha != '\0') {
      auVar43 = auVar49;
    }
    local_128.m_c[1] = (float)(int)auVar49._0_8_;
    local_128.m_c[2] = (float)(int)((ulong)auVar49._0_8_ >> 0x20);
    local_128.m_c[0] = (float)*(undefined4 *)(&DAT_00304060 + (ulong)bVar21 * 4);
    local_128.m_c[3] = auVar43._0_4_;
    vec4F_normalize_in_place(&local_128);
    afVar59 = (float  [4])ZEXT416((uint)local_128.m_c[0]);
  }
  uVar15 = pParams->m_num_pixels;
  local_c8 = local_128.m_c[2];
  fStack_c4 = local_128.m_c[3];
  auVar43 = insertps((undefined1  [16])afVar59,local_128.m_c[1],0x10);
  fVar38 = 1e+09;
  fVar47 = -1e+09;
  lVar17 = 0;
  uVar56 = 0;
  fVar51 = 0.0;
  fVar31 = 0.0;
  while( true ) {
    fVar30 = auVar43._0_4_;
    fVar37 = auVar43._4_4_;
    if ((ulong)uVar15 << 2 == lVar17) break;
    local_f8 = CONCAT44(uVar56,fVar47);
    fStack_f0 = fVar51;
    fStack_ec = fVar31;
    bVar61 = vec4F_from_color((color_quad_u8 *)(pParams->m_pPixels->m_c + lVar17));
    fVar51 = (bVar61.m_c[3] - (float)local_108._4_4_) * fStack_c4 +
             (bVar61.m_c[0] - local_118) * fVar30 + (bVar61.m_c[1] - fStack_114) * fVar37 +
             (bVar61.m_c[2] - (float)local_108._0_4_) * local_c8;
    if (fVar51 <= fVar38) {
      fVar38 = fVar51;
    }
    fVar47 = (float)local_f8;
    if ((float)local_f8 <= fVar51) {
      fVar47 = fVar51;
    }
    lVar17 = lVar17 + 4;
    uVar56 = local_f8._4_4_;
    fVar51 = fStack_f0;
    fVar31 = fStack_ec;
  }
  fVar38 = fVar38 * 0.003921569;
  fVar47 = fVar47 * 0.003921569;
  c0.m_c[0] = fVar38 * fVar30 + local_198.m_c[0];
  c0.m_c[1] = fVar38 * fVar37 + local_198.m_c[1];
  uVar23._0_4_ = fVar38 * local_c8 + local_198.m_c[2];
  uVar23._4_4_ = fVar38 * fStack_c4 + local_198.m_c[3];
  c1.m_c[0] = fVar30 * fVar47 + local_198.m_c[0];
  c1.m_c[1] = fVar37 * fVar47 + local_198.m_c[1];
  c1.m_c[2] = fVar47 * local_c8 + local_198.m_c[2];
  c1.m_c[3] = fVar47 * fStack_c4 + local_198.m_c[3];
  c0.m_c._8_8_ = uVar23;
  bVar61 = vec4F_saturate(&c0);
  uStack_100 = extraout_XMM0_Qb_01;
  local_108 = (undefined1  [8])bVar61.m_c._0_8_;
  local_118 = bVar61.m_c[2];
  fStack_114 = bVar61.m_c[3];
  fStack_110 = (float)uVar23;
  fStack_10c = SUB84(uVar23,4);
  bVar61 = vec4F_saturate(&c1);
  auVar33._0_8_ = bVar61.m_c._8_8_;
  auVar33._8_4_ = (float)uVar23;
  auVar33._12_4_ = SUB84(uVar23,4);
  auVar28._0_8_ = bVar61.m_c._0_8_;
  auVar28._8_8_ = extraout_XMM0_Qb_02;
  auVar46._4_4_ = fStack_114;
  auVar46._0_4_ = local_118;
  auVar46._8_4_ = fStack_110;
  auVar46._12_4_ = fStack_10c;
  auVar49 = insertps(auVar46,auVar33,0x1c);
  auVar39._8_4_ = (float)uVar23;
  auVar39._0_8_ = auVar33._0_8_;
  auVar39._12_4_ = SUB84(uVar23,4);
  auVar43 = insertps(auVar39,auVar46,0x4c);
  auVar40 = _local_108;
  if (auVar43._0_4_ + auVar49._0_4_ + local_108._0_4_ + local_108._4_4_ <=
      auVar43._4_4_ + auVar49._4_4_ + bVar61.m_c[0] + bVar61.m_c[1]) {
    auVar40._8_4_ = (int)extraout_XMM0_Qb_02;
    auVar40._0_8_ = auVar28._0_8_;
    auVar40._12_4_ = (int)((ulong)extraout_XMM0_Qb_02 >> 0x20);
    auVar45._8_4_ = (float)uVar23;
    auVar45._0_8_ = auVar33._0_8_;
    auVar45._12_4_ = SUB84(uVar23,4);
    auVar28 = _local_108;
    auVar33 = auVar46;
    auVar46 = auVar45;
  }
  bVar61.m_c._0_8_ = auVar28._0_8_;
  bVar61.m_c._8_8_ = auVar33._0_8_;
  xh.m_c._0_8_ = auVar40._0_8_;
  xh.m_c._8_8_ = auVar46._0_8_;
  uVar12 = find_optimal_solution(local_19c,bVar61,xh,pParams,pResults);
  if (uVar12 == 0) {
    return 0;
  }
  uVar15 = 0xffffffff;
  while (uVar15 = uVar15 + 1, uVar15 < local_e0->m_least_squares_passes) {
    selectors_temp[0] = '\0';
    selectors_temp[1] = '\0';
    selectors_temp[2] = '\0';
    selectors_temp[3] = '\0';
    selectors_temp[4] = '\0';
    selectors_temp[5] = '\0';
    selectors_temp[6] = '\0';
    selectors_temp[7] = '\0';
    selectors_temp[8] = '\0';
    selectors_temp[9] = '\0';
    selectors_temp[10] = '\0';
    selectors_temp[0xb] = '\0';
    selectors_temp[0xc] = '\0';
    selectors_temp[0xd] = '\0';
    selectors_temp[0xe] = '\0';
    selectors_temp[0xf] = '\0';
    selectors_temp1[0] = '\0';
    selectors_temp1[1] = '\0';
    selectors_temp1[2] = '\0';
    selectors_temp1[3] = '\0';
    selectors_temp1[4] = '\0';
    selectors_temp1[5] = '\0';
    selectors_temp1[6] = '\0';
    selectors_temp1[7] = '\0';
    selectors_temp1[8] = '\0';
    selectors_temp1[9] = '\0';
    selectors_temp1[10] = '\0';
    selectors_temp1[0xb] = '\0';
    selectors_temp1[0xc] = '\0';
    selectors_temp1[0xd] = '\0';
    selectors_temp1[0xe] = '\0';
    selectors_temp1[0xf] = '\0';
    if (pParams->m_has_alpha == '\0') {
      compute_least_squares_endpoints_rgb
                (pParams->m_num_pixels,pResults->m_pSelectors,pParams->m_pSelector_weightsx,
                 (bc7enc_vec4F *)selectors_temp,(bc7enc_vec4F *)selectors_temp1,pParams->m_pPixels);
    }
    else {
      compute_least_squares_endpoints_rgba
                (pParams->m_num_pixels,pResults->m_pSelectors,pParams->m_pSelector_weightsx,
                 (bc7enc_vec4F *)selectors_temp,(bc7enc_vec4F *)selectors_temp1,pParams->m_pPixels);
    }
    xl.m_c[0] = (float)selectors_temp._0_8_ * 0.003921569;
    xl.m_c[1] = SUB84(selectors_temp._0_8_,4) * 0.003921569;
    xl.m_c[2] = (float)selectors_temp._8_8_ * 0.003921569;
    xl.m_c[3] = SUB84(selectors_temp._8_8_,4) * 0.003921569;
    xh_00.m_c[0] = (float)selectors_temp1._0_8_ * 0.003921569;
    xh_00.m_c[1] = SUB84(selectors_temp1._0_8_,4) * 0.003921569;
    xh_00.m_c[2] = (float)selectors_temp1._8_8_ * 0.003921569;
    xh_00.m_c[3] = SUB84(selectors_temp1._8_8_,4) * 0.003921569;
    uVar12 = find_optimal_solution(local_19c,xl,xh_00,pParams,pResults);
    if (uVar12 == 0) {
      return 0;
    }
  }
  if (pParams->m_pForce_selectors != (uint8_t *)0x0) goto switchD_0020b342_caseD_9;
  if (local_e0->m_uber_level != 0) {
    uVar15 = pParams->m_num_pixels;
    uVar11 = (ulong)uVar15;
    memcpy(selectors_temp,pResults->m_pSelectors,uVar11);
    uVar18 = 0x100;
    uVar19 = 0;
    for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
      bVar1 = selectors_temp[uVar13];
      if (bVar1 <= uVar18) {
        uVar18 = (uint)bVar1;
      }
      if (uVar19 <= bVar1) {
        uVar19 = (uint)bVar1;
      }
    }
    local_f8 = (ulong)pParams->m_num_selector_weights;
    uVar16 = pParams->m_num_selector_weights - 1;
    for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
      bVar1 = selectors_temp[uVar13];
      selectors_temp1[uVar13] = bVar1 + ((bVar1 <= uVar16 && uVar16 != bVar1) && uVar18 == bVar1);
    }
    local_178.m_c = (float  [4])ZEXT816(0);
    local_188.m_c = (float  [4])ZEXT816(0);
    if (pParams->m_has_alpha == '\0') {
      compute_least_squares_endpoints_rgb
                (uVar15,selectors_temp1,pParams->m_pSelector_weightsx,&local_178,&local_188,
                 pParams->m_pPixels);
    }
    else {
      compute_least_squares_endpoints_rgba
                (uVar15,selectors_temp1,pParams->m_pSelector_weightsx,&local_178,&local_188,
                 pParams->m_pPixels);
    }
    xl_00.m_c[0] = local_178.m_c[0] * 0.003921569;
    xl_00.m_c[1] = local_178.m_c[1] * 0.003921569;
    xl_00.m_c[2] = local_178.m_c[2] * 0.003921569;
    xl_00.m_c[3] = local_178.m_c[3] * 0.003921569;
    local_178.m_c[2] = xl_00.m_c[2];
    local_178.m_c[3] = xl_00.m_c[3];
    local_178.m_c[0] = xl_00.m_c[0];
    local_178.m_c[1] = xl_00.m_c[1];
    xh_01.m_c[0] = local_188.m_c[0] * 0.003921569;
    xh_01.m_c[1] = local_188.m_c[1] * 0.003921569;
    xh_01.m_c[2] = local_188.m_c[2] * 0.003921569;
    xh_01.m_c[3] = local_188.m_c[3] * 0.003921569;
    local_188.m_c[2] = xh_01.m_c[2];
    local_188.m_c[3] = xh_01.m_c[3];
    local_188.m_c[0] = xh_01.m_c[0];
    local_188.m_c[1] = xh_01.m_c[1];
    uVar12 = find_optimal_solution(local_19c,xl_00,xh_01,pParams,pResults);
    if (uVar12 == 0) {
      return 0;
    }
    uVar15 = pParams->m_num_pixels;
    for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
      bVar1 = selectors_temp[uVar13];
      selectors_temp1[uVar13] = bVar1 - (uVar19 == bVar1 && bVar1 != 0);
    }
    if (pParams->m_has_alpha == '\0') {
      compute_least_squares_endpoints_rgb
                (uVar15,selectors_temp1,pParams->m_pSelector_weightsx,&local_178,&local_188,
                 pParams->m_pPixels);
    }
    else {
      compute_least_squares_endpoints_rgba
                (uVar15,selectors_temp1,pParams->m_pSelector_weightsx,&local_178,&local_188,
                 pParams->m_pPixels);
    }
    xl_01.m_c[0] = local_178.m_c[0] * 0.003921569;
    xl_01.m_c[1] = local_178.m_c[1] * 0.003921569;
    xl_01.m_c[2] = local_178.m_c[2] * 0.003921569;
    xl_01.m_c[3] = local_178.m_c[3] * 0.003921569;
    local_178.m_c[2] = xl_01.m_c[2];
    local_178.m_c[3] = xl_01.m_c[3];
    local_178.m_c[0] = xl_01.m_c[0];
    local_178.m_c[1] = xl_01.m_c[1];
    xh_02.m_c[0] = local_188.m_c[0] * 0.003921569;
    xh_02.m_c[1] = local_188.m_c[1] * 0.003921569;
    xh_02.m_c[2] = local_188.m_c[2] * 0.003921569;
    xh_02.m_c[3] = local_188.m_c[3] * 0.003921569;
    local_188.m_c[2] = xh_02.m_c[2];
    local_188.m_c[3] = xh_02.m_c[3];
    local_188.m_c[0] = xh_02.m_c[0];
    local_188.m_c[1] = xh_02.m_c[1];
    uVar12 = find_optimal_solution(local_19c,xl_01,xh_02,pParams,pResults);
    if (uVar12 == 0) {
      return 0;
    }
    uVar15 = pParams->m_num_pixels;
    for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
      bVar1 = selectors_temp[uVar13];
      if ((uVar18 != bVar1) || (cVar14 = '\x01', pParams->m_num_selector_weights - 1 <= uVar18)) {
        cVar14 = -(bVar1 != 0 && uVar19 == bVar1);
      }
      selectors_temp1[uVar13] = bVar1 + cVar14;
    }
    if (pParams->m_has_alpha == '\0') {
      compute_least_squares_endpoints_rgb
                (uVar15,selectors_temp1,pParams->m_pSelector_weightsx,&local_178,&local_188,
                 pParams->m_pPixels);
    }
    else {
      compute_least_squares_endpoints_rgba
                (uVar15,selectors_temp1,pParams->m_pSelector_weightsx,&local_178,&local_188,
                 pParams->m_pPixels);
    }
    fVar30 = (float)DAT_00264380;
    fVar37 = DAT_00264380._4_4_;
    xl_02.m_c[0] = local_178.m_c[0] * fVar30;
    xl_02.m_c[1] = local_178.m_c[1] * fVar37;
    fVar47 = local_178.m_c[2] * fVar30;
    fVar51 = local_178.m_c[3] * fVar37;
    auVar34._0_8_ = CONCAT44(fVar51,fVar47);
    auVar34._8_4_ = DAT_00264380._8_4_ * 0.0;
    auVar34._12_4_ = DAT_00264380._12_4_ * 0.0;
    fVar31 = local_188.m_c[0] * fVar30;
    fVar38 = local_188.m_c[1] * fVar37;
    auVar41._0_8_ = CONCAT44(fVar38,fVar31);
    auVar41._8_4_ = DAT_00264380._8_4_ * 0.0;
    auVar41._12_4_ = DAT_00264380._12_4_ * 0.0;
    xh_03.m_c[2] = local_188.m_c[2] * fVar30;
    xh_03.m_c[3] = local_188.m_c[3] * fVar37;
    xl_02.m_c[2] = fVar47;
    xl_02.m_c[3] = fVar51;
    auVar35._8_8_ = auVar34._8_8_;
    auVar35._0_8_ = auVar34._0_8_;
    xh_03.m_c[0] = fVar31;
    xh_03.m_c[1] = fVar38;
    auVar42._8_8_ = auVar41._8_8_;
    auVar42._0_8_ = auVar41._0_8_;
    auVar43 = _DAT_00264380;
    uVar12 = find_optimal_solution(local_19c,xl_02,xh_03,pParams,pResults);
    if (uVar12 == 0) {
      return 0;
    }
    uVar15 = local_e0->m_uber_level;
    if ((1 < uVar15) && ((ulong)(pParams->m_num_pixels * 0x38 >> 4) < pResults->m_best_overall_err))
    {
      iVar9 = 1;
      if (3 < uVar15) {
        iVar9 = uVar15 - 2;
      }
      local_f8 = (ulong)((int)local_f8 - 2);
      auVar50._4_12_ = auVar43._4_12_;
      auVar50._0_4_ = (float)(int)uVar16;
      local_118 = auVar50._0_4_;
      for (iVar20 = -iVar9; iVar20 < 2; iVar20 = iVar20 + 1) {
        fVar47 = (float)iVar20;
        local_108._0_4_ = fVar47;
        uVar13 = local_f8 & 0xffffffff;
        while (uVar15 = (uint)uVar13, (int)uVar15 <= (int)(iVar9 + uVar16)) {
          if (uVar15 != uVar16 || iVar20 != 0) {
            uVar18 = pParams->m_num_pixels;
            for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
              auVar36._4_12_ = auVar35._4_12_;
              auVar36._0_4_ =
                   (((float)selectors_temp[uVar13] - fVar47) * auVar50._0_4_) /
                   ((float)(int)uVar15 - fVar47) + 0.5;
              auVar42 = roundss(auVar42,auVar36,9);
              auVar35._0_12_ = ZEXT812(0);
              auVar35._12_4_ = 0;
              if ((0.0 <= auVar42._0_4_) && (auVar35 = auVar42, auVar50._0_4_ < auVar42._0_4_)) {
                auVar35 = auVar50;
              }
              selectors_temp1[uVar13] = (uint8_t)(int)auVar35._0_4_;
            }
            local_188.m_c._0_12_ = ZEXT812(0);
            local_188.m_c[3] = 0.0;
            local_178.m_c = local_188.m_c;
            if (pParams->m_has_alpha == '\0') {
              compute_least_squares_endpoints_rgb
                        (uVar18,selectors_temp1,pParams->m_pSelector_weightsx,&local_178,&local_188,
                         pParams->m_pPixels);
            }
            else {
              compute_least_squares_endpoints_rgba
                        (uVar18,selectors_temp1,pParams->m_pSelector_weightsx,&local_178,&local_188,
                         pParams->m_pPixels);
            }
            xl_03.m_c[0] = local_178.m_c[0] * 0.003921569;
            xl_03.m_c[1] = local_178.m_c[1] * 0.003921569;
            fVar47 = local_178.m_c[2] * 0.003921569;
            local_178.m_c[3] = local_178.m_c[3] * 0.003921569;
            xl_03.m_c._8_8_ = CONCAT44(local_178.m_c[3],fVar47);
            local_178.m_c[2] = fVar47;
            local_178.m_c[0] = xl_03.m_c[0];
            local_178.m_c[1] = xl_03.m_c[1];
            fVar47 = local_188.m_c[0] * 0.003921569;
            fVar51 = local_188.m_c[1] * 0.003921569;
            xh_04.m_c._0_8_ = CONCAT44(fVar51,fVar47);
            xh_04.m_c[2] = local_188.m_c[2] * 0.003921569;
            xh_04.m_c[3] = local_188.m_c[3] * 0.003921569;
            local_188.m_c[2] = xh_04.m_c[2];
            local_188.m_c[3] = xh_04.m_c[3];
            local_188.m_c[0] = fVar47;
            local_188.m_c[1] = fVar51;
            auVar35._8_8_ = 0;
            auVar35._0_8_ = xl_03.m_c._8_8_;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = xh_04.m_c._0_8_;
            uVar12 = find_optimal_solution(local_19c,xl_03,xh_04,pParams,pResults);
            auVar50 = ZEXT416((uint)local_118);
            fVar47 = (float)local_108._0_4_;
            if (uVar12 == 0) {
              return 0;
            }
          }
          uVar13 = (ulong)(uVar15 + 1);
        }
      }
    }
    if (pParams->m_pForce_selectors != (uint8_t *)0x0) goto switchD_0020b342_caseD_9;
  }
  if (local_19c == 1) {
    selectors_temp._0_8_ = pResults->m_best_overall_err;
    selectors_temp[8] = (pResults->m_low_endpoint).m_c[0];
    selectors_temp[9] = (pResults->m_low_endpoint).m_c[1];
    selectors_temp[10] = (pResults->m_low_endpoint).m_c[2];
    selectors_temp[0xb] = (pResults->m_low_endpoint).m_c[3];
    selectors_temp[0xc] = (pResults->m_high_endpoint).m_c[0];
    selectors_temp[0xd] = (pResults->m_high_endpoint).m_c[1];
    selectors_temp[0xe] = (pResults->m_high_endpoint).m_c[2];
    selectors_temp[0xf] = (pResults->m_high_endpoint).m_c[3];
    local_148 = *&pResults->m_pbits;
    puStack_140 = pResults->m_pSelectors;
    local_138 = pResults->m_pSelectors_temp;
    cStack_130.m_c = (pResults->m_astc_low_endpoint).m_c[0];
    cStack_12c.m_c = (pResults->m_astc_high_endpoint).m_c[0];
    uVar13 = pack_mode1_to_one_color
                       (pParams,(color_cell_compressor_results *)selectors_temp,
                        (int)(local_198.m_c[0] * 255.0 + 0.5),(int)(local_198.m_c[1] * 255.0 + 0.5),
                        (int)(local_198.m_c[2] * 255.0 + 0.5),pResults->m_pSelectors_temp);
  }
  else {
    switch(pParams->m_astc_endpoint_range) {
    case 7:
      if ((pParams->m_num_selector_weights != 4) || (pParams->m_has_alpha != '\0'))
      goto switchD_0020b342_caseD_9;
      selectors_temp._0_8_ = pResults->m_best_overall_err;
      selectors_temp[8] = (pResults->m_low_endpoint).m_c[0];
      selectors_temp[9] = (pResults->m_low_endpoint).m_c[1];
      selectors_temp[10] = (pResults->m_low_endpoint).m_c[2];
      selectors_temp[0xb] = (pResults->m_low_endpoint).m_c[3];
      selectors_temp[0xc] = (pResults->m_high_endpoint).m_c[0];
      selectors_temp[0xd] = (pResults->m_high_endpoint).m_c[1];
      selectors_temp[0xe] = (pResults->m_high_endpoint).m_c[2];
      selectors_temp[0xf] = (pResults->m_high_endpoint).m_c[3];
      local_148 = *&pResults->m_pbits;
      puStack_140 = pResults->m_pSelectors;
      local_138 = pResults->m_pSelectors_temp;
      cStack_130.m_c = (pResults->m_astc_low_endpoint).m_c[0];
      cStack_12c.m_c = (pResults->m_astc_high_endpoint).m_c[0];
      uVar13 = pack_astc_range7_2bit_to_one_color
                         (pParams,(color_cell_compressor_results *)selectors_temp,
                          (int)(local_198.m_c[0] * 255.0 + 0.5),
                          (int)(local_198.m_c[1] * 255.0 + 0.5),
                          (int)(local_198.m_c[2] * 255.0 + 0.5),pResults->m_pSelectors_temp);
      break;
    case 8:
      if (pParams->m_num_selector_weights == 4) {
        if (pParams->m_has_alpha == '\0') goto switchD_0020b342_caseD_9;
        selectors_temp._0_8_ = pResults->m_best_overall_err;
        selectors_temp[8] = (pResults->m_low_endpoint).m_c[0];
        selectors_temp[9] = (pResults->m_low_endpoint).m_c[1];
        selectors_temp[10] = (pResults->m_low_endpoint).m_c[2];
        selectors_temp[0xb] = (pResults->m_low_endpoint).m_c[3];
        selectors_temp[0xc] = (pResults->m_high_endpoint).m_c[0];
        selectors_temp[0xd] = (pResults->m_high_endpoint).m_c[1];
        selectors_temp[0xe] = (pResults->m_high_endpoint).m_c[2];
        selectors_temp[0xf] = (pResults->m_high_endpoint).m_c[3];
        local_148 = *&pResults->m_pbits;
        puStack_140 = pResults->m_pSelectors;
        local_138 = pResults->m_pSelectors_temp;
        cStack_130.m_c = (pResults->m_astc_low_endpoint).m_c[0];
        cStack_12c.m_c = (pResults->m_astc_high_endpoint).m_c[0];
        uVar13 = pack_astc_4bit_2bit_to_one_color_rgba
                           (pParams,(color_cell_compressor_results *)selectors_temp,
                            (int)(local_198.m_c[0] * 255.0 + 0.5),
                            (int)(local_198.m_c[1] * 255.0 + 0.5),
                            (int)(local_198.m_c[2] * 255.0 + 0.5),
                            (int)(local_198.m_c[3] * 255.0 + 0.5),pResults->m_pSelectors_temp);
      }
      else {
        if ((pParams->m_num_selector_weights != 8) || (pParams->m_has_alpha != '\0'))
        goto switchD_0020b342_caseD_9;
        selectors_temp._0_8_ = pResults->m_best_overall_err;
        selectors_temp[8] = (pResults->m_low_endpoint).m_c[0];
        selectors_temp[9] = (pResults->m_low_endpoint).m_c[1];
        selectors_temp[10] = (pResults->m_low_endpoint).m_c[2];
        selectors_temp[0xb] = (pResults->m_low_endpoint).m_c[3];
        selectors_temp[0xc] = (pResults->m_high_endpoint).m_c[0];
        selectors_temp[0xd] = (pResults->m_high_endpoint).m_c[1];
        selectors_temp[0xe] = (pResults->m_high_endpoint).m_c[2];
        selectors_temp[0xf] = (pResults->m_high_endpoint).m_c[3];
        local_148 = *&pResults->m_pbits;
        puStack_140 = pResults->m_pSelectors;
        local_138 = pResults->m_pSelectors_temp;
        cStack_130.m_c = (pResults->m_astc_low_endpoint).m_c[0];
        cStack_12c.m_c = (pResults->m_astc_high_endpoint).m_c[0];
        uVar13 = pack_astc_4bit_3bit_to_one_color
                           (pParams,(color_cell_compressor_results *)selectors_temp,
                            (int)(local_198.m_c[0] * 255.0 + 0.5),
                            (int)(local_198.m_c[1] * 255.0 + 0.5),
                            (int)(local_198.m_c[2] * 255.0 + 0.5),pResults->m_pSelectors_temp);
      }
      break;
    default:
      goto switchD_0020b342_caseD_9;
    case 0xb:
      if ((pParams->m_num_selector_weights != 0x20) || (pParams->m_has_alpha != '\0'))
      goto switchD_0020b342_caseD_9;
      selectors_temp._0_8_ = pResults->m_best_overall_err;
      selectors_temp[8] = (pResults->m_low_endpoint).m_c[0];
      selectors_temp[9] = (pResults->m_low_endpoint).m_c[1];
      selectors_temp[10] = (pResults->m_low_endpoint).m_c[2];
      selectors_temp[0xb] = (pResults->m_low_endpoint).m_c[3];
      selectors_temp[0xc] = (pResults->m_high_endpoint).m_c[0];
      selectors_temp[0xd] = (pResults->m_high_endpoint).m_c[1];
      selectors_temp[0xe] = (pResults->m_high_endpoint).m_c[2];
      selectors_temp[0xf] = (pResults->m_high_endpoint).m_c[3];
      local_148 = *&pResults->m_pbits;
      puStack_140 = pResults->m_pSelectors;
      local_138 = pResults->m_pSelectors_temp;
      cStack_130.m_c = (pResults->m_astc_low_endpoint).m_c[0];
      cStack_12c.m_c = (pResults->m_astc_high_endpoint).m_c[0];
      uVar13 = pack_astc_range11_5bit_to_one_color
                         (pParams,(color_cell_compressor_results *)selectors_temp,
                          (int)(local_198.m_c[0] * 255.0 + 0.5),
                          (int)(local_198.m_c[1] * 255.0 + 0.5),
                          (int)(local_198.m_c[2] * 255.0 + 0.5),pResults->m_pSelectors_temp);
      break;
    case 0xd:
      if ((pParams->m_num_selector_weights != 4) || (pParams->m_has_alpha != '\0'))
      goto switchD_0020b342_caseD_9;
      selectors_temp._0_8_ = pResults->m_best_overall_err;
      selectors_temp[8] = (pResults->m_low_endpoint).m_c[0];
      selectors_temp[9] = (pResults->m_low_endpoint).m_c[1];
      selectors_temp[10] = (pResults->m_low_endpoint).m_c[2];
      selectors_temp[0xb] = (pResults->m_low_endpoint).m_c[3];
      selectors_temp[0xc] = (pResults->m_high_endpoint).m_c[0];
      selectors_temp[0xd] = (pResults->m_high_endpoint).m_c[1];
      selectors_temp[0xe] = (pResults->m_high_endpoint).m_c[2];
      selectors_temp[0xf] = (pResults->m_high_endpoint).m_c[3];
      local_148 = *&pResults->m_pbits;
      puStack_140 = pResults->m_pSelectors;
      local_138 = pResults->m_pSelectors_temp;
      cStack_130.m_c = (pResults->m_astc_low_endpoint).m_c[0];
      cStack_12c.m_c = (pResults->m_astc_high_endpoint).m_c[0];
      uVar13 = pack_astc_range13_2bit_to_one_color
                         (pParams,(color_cell_compressor_results *)selectors_temp,
                          (int)(local_198.m_c[0] * 255.0 + 0.5),
                          (int)(local_198.m_c[1] * 255.0 + 0.5),
                          (int)(local_198.m_c[2] * 255.0 + 0.5),pResults->m_pSelectors_temp);
    }
  }
  if (uVar13 < pResults->m_best_overall_err) {
    *&pResults->m_pbits = local_148;
    pResults->m_pSelectors = puStack_140;
    pResults->m_pSelectors_temp = local_138;
    pResults->m_astc_low_endpoint = (color_quad_u8)cStack_130.m_c;
    pResults->m_astc_high_endpoint = (color_quad_u8)cStack_12c.m_c;
    pResults->m_best_overall_err = selectors_temp._0_8_;
    (pResults->m_low_endpoint).m_c[0] = selectors_temp[8];
    (pResults->m_low_endpoint).m_c[1] = selectors_temp[9];
    (pResults->m_low_endpoint).m_c[2] = selectors_temp[10];
    (pResults->m_low_endpoint).m_c[3] = selectors_temp[0xb];
    (pResults->m_high_endpoint).m_c[0] = selectors_temp[0xc];
    (pResults->m_high_endpoint).m_c[1] = selectors_temp[0xd];
    (pResults->m_high_endpoint).m_c[2] = selectors_temp[0xe];
    (pResults->m_high_endpoint).m_c[3] = selectors_temp[0xf];
    memcpy(pResults->m_pSelectors,pResults->m_pSelectors_temp,(ulong)pParams->m_num_pixels);
    pResults->m_best_overall_err = uVar13;
  }
switchD_0020b342_caseD_9:
  return pResults->m_best_overall_err;
}

Assistant:

uint64_t color_cell_compression(uint32_t mode, const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults, const bc7enc_compress_block_params *pComp_params)
{
	if (!pParams->m_astc_endpoint_range)
	{
		assert((mode == 6) || (!pParams->m_has_alpha));
	}
	assert(pParams->m_num_selector_weights >= 1 && pParams->m_num_selector_weights <= 32);
	assert(pParams->m_pSelector_weights[0] == 0);
	assert(pParams->m_pSelector_weights[pParams->m_num_selector_weights - 1] == 64);

	pResults->m_best_overall_err = UINT64_MAX;

	uint32_t cr, cg, cb, ca;

	// If the partition's colors are all the same, then just pack them as a single color.
	if (!pParams->m_pForce_selectors)
	{
		if (mode == 1)
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_mode1_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 8) && (pParams->m_num_selector_weights == 8) && (!pParams->m_has_alpha))
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_astc_4bit_3bit_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 7) && (pParams->m_num_selector_weights == 4) && (!pParams->m_has_alpha))
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_astc_range7_2bit_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 8) && (pParams->m_num_selector_weights == 4) && (pParams->m_has_alpha))
		{
			if (is_solid_rgba(pParams, cr, cg, cb, ca))
				return pack_astc_4bit_2bit_to_one_color_rgba(pParams, pResults, cr, cg, cb, ca, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 13) && (pParams->m_num_selector_weights == 4) && (!pParams->m_has_alpha))
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_astc_range13_2bit_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 11) && (pParams->m_num_selector_weights == 32) && (!pParams->m_has_alpha))
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_astc_range11_5bit_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
	}

	// Compute partition's mean color and principle axis.
	bc7enc_vec4F meanColor, axis;
	vec4F_set_scalar(&meanColor, 0.0f);

	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
	{
		bc7enc_vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);
		meanColor = vec4F_add(&meanColor, &color);
	}
				
	bc7enc_vec4F meanColorScaled = vec4F_mul(&meanColor, 1.0f / (float)(pParams->m_num_pixels));

	meanColor = vec4F_mul(&meanColor, 1.0f / (float)(pParams->m_num_pixels * 255.0f));
	vec4F_saturate_in_place(&meanColor);
	
	if (pParams->m_has_alpha)
	{
		// Use incremental PCA for RGBA PCA, because it's simple.
		vec4F_set_scalar(&axis, 0.0f);
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			bc7enc_vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);
			color = vec4F_sub(&color, &meanColorScaled);
			bc7enc_vec4F a = vec4F_mul(&color, color.m_c[0]);
			bc7enc_vec4F b = vec4F_mul(&color, color.m_c[1]);
			bc7enc_vec4F c = vec4F_mul(&color, color.m_c[2]);
			bc7enc_vec4F d = vec4F_mul(&color, color.m_c[3]);
			bc7enc_vec4F n = i ? axis : color;
			vec4F_normalize_in_place(&n);
			axis.m_c[0] += vec4F_dot(&a, &n);
			axis.m_c[1] += vec4F_dot(&b, &n);
			axis.m_c[2] += vec4F_dot(&c, &n);
			axis.m_c[3] += vec4F_dot(&d, &n);
		}
		vec4F_normalize_in_place(&axis);
	}
	else
	{
		// Use covar technique for RGB PCA, because it doesn't require per-pixel normalization.
		float cov[6] = { 0, 0, 0, 0, 0, 0 };

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			const color_quad_u8 *pV = &pParams->m_pPixels[i];
			float r = pV->m_c[0] - meanColorScaled.m_c[0];
			float g = pV->m_c[1] - meanColorScaled.m_c[1];
			float b = pV->m_c[2] - meanColorScaled.m_c[2];
			cov[0] += r*r; cov[1] += r*g; cov[2] += r*b; cov[3] += g*g; cov[4] += g*b; cov[5] += b*b;
		}

		float xr = .9f, xg = 1.0f, xb = .7f;
		for (uint32_t iter = 0; iter < 3; iter++)
		{
			float r = xr * cov[0] + xg * cov[1] + xb * cov[2];
			float g = xr * cov[1] + xg * cov[3] + xb * cov[4];
			float b = xr * cov[2] + xg * cov[4] + xb * cov[5];

			float m = maximumf(maximumf(fabsf(r), fabsf(g)), fabsf(b));
			if (m > 1e-10f)
			{
				m = 1.0f / m;
				r *= m; g *= m; b *= m;
			}

			xr = r; xg = g; xb = b;
		}

		float len = xr * xr + xg * xg + xb * xb;
		if (len < 1e-10f)
			vec4F_set_scalar(&axis, 0.0f);
		else
		{
			len = 1.0f / sqrtf(len);
			xr *= len; xg *= len; xb *= len;
			vec4F_set(&axis, xr, xg, xb, 0);
		}
	}
				
	if (vec4F_dot(&axis, &axis) < .5f)
	{
		if (pParams->m_perceptual)
			vec4F_set(&axis, .213f, .715f, .072f, pParams->m_has_alpha ? .715f : 0);
		else
			vec4F_set(&axis, 1.0f, 1.0f, 1.0f, pParams->m_has_alpha ? 1.0f : 0);
		vec4F_normalize_in_place(&axis);
	}
			
	bc7enc_vec4F minColor, maxColor;

	float l = 1e+9f, h = -1e+9f;

	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
	{
		bc7enc_vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);

		bc7enc_vec4F q = vec4F_sub(&color, &meanColorScaled);
		float d = vec4F_dot(&q, &axis);

		l = minimumf(l, d);
		h = maximumf(h, d);
	}

	l *= (1.0f / 255.0f);
	h *= (1.0f / 255.0f);

	bc7enc_vec4F b0 = vec4F_mul(&axis, l);
	bc7enc_vec4F b1 = vec4F_mul(&axis, h);
	bc7enc_vec4F c0 = vec4F_add(&meanColor, &b0);
	bc7enc_vec4F c1 = vec4F_add(&meanColor, &b1);
	minColor = vec4F_saturate(&c0);
	maxColor = vec4F_saturate(&c1);
				
	bc7enc_vec4F whiteVec;
	vec4F_set_scalar(&whiteVec, 1.0f);
	if (vec4F_dot(&minColor, &whiteVec) > vec4F_dot(&maxColor, &whiteVec))
	{
#if 1
		std::swap(minColor.m_c[0], maxColor.m_c[0]);
		std::swap(minColor.m_c[1], maxColor.m_c[1]);
		std::swap(minColor.m_c[2], maxColor.m_c[2]);
		std::swap(minColor.m_c[3], maxColor.m_c[3]);
#elif 0
		// Fails to compile correctly with MSVC 2019 (code generation bug)
		std::swap(minColor, maxColor);
#else
		// Fails with MSVC 2019
		bc7enc_vec4F temp = minColor;
		minColor = maxColor;
		maxColor = temp;
#endif
	}

	// First find a solution using the block's PCA.
	if (!find_optimal_solution(mode, minColor, maxColor, pParams, pResults))
		return 0;
	
	for (uint32_t i = 0; i < pComp_params->m_least_squares_passes; i++)
	{
		// Now try to refine the solution using least squares by computing the optimal endpoints from the current selectors.
		bc7enc_vec4F xl, xh;
		vec4F_set_scalar(&xl, 0.0f);
		vec4F_set_scalar(&xh, 0.0f);
		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, pResults->m_pSelectors, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, pResults->m_pSelectors, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));
				
		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;
	}
	
	if ((!pParams->m_pForce_selectors) && (pComp_params->m_uber_level > 0))
	{
		// In uber level 1, try varying the selectors a little, somewhat like cluster fit would. First try incrementing the minimum selectors,
		// then try decrementing the selectrors, then try both.
		uint8_t selectors_temp[16], selectors_temp1[16];
		memcpy(selectors_temp, pResults->m_pSelectors, pParams->m_num_pixels);

		const int max_selector = pParams->m_num_selector_weights - 1;

		uint32_t min_sel = 256;
		uint32_t max_sel = 0;
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			min_sel = minimumu(min_sel, sel);
			max_sel = maximumu(max_sel, sel);
		}

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == min_sel) && (sel < (pParams->m_num_selector_weights - 1)))
				sel++;
			selectors_temp1[i] = (uint8_t)sel;
		}

		bc7enc_vec4F xl, xh;
		vec4F_set_scalar(&xl, 0.0f);
		vec4F_set_scalar(&xh, 0.0f);
		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));
				
		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == max_sel) && (sel > 0))
				sel--;
			selectors_temp1[i] = (uint8_t)sel;
		}

		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));
				
		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == min_sel) && (sel < (pParams->m_num_selector_weights - 1)))
				sel++;
			else if ((sel == max_sel) && (sel > 0))
				sel--;
			selectors_temp1[i] = (uint8_t)sel;
		}

		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		// In uber levels 2+, try taking more advantage of endpoint extrapolation by scaling the selectors in one direction or another.
		const uint32_t uber_err_thresh = (pParams->m_num_pixels * 56) >> 4;
		if ((pComp_params->m_uber_level >= 2) && (pResults->m_best_overall_err > uber_err_thresh))
		{
			const int Q = (pComp_params->m_uber_level >= 4) ? (pComp_params->m_uber_level - 2) : 1;
			for (int ly = -Q; ly <= 1; ly++)
			{
				for (int hy = max_selector - 1; hy <= (max_selector + Q); hy++)
				{
					if ((ly == 0) && (hy == max_selector))
						continue;

					for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
						selectors_temp1[i] = (uint8_t)clampf(floorf((float)max_selector * ((float)selectors_temp[i] - (float)ly) / ((float)hy - (float)ly) + .5f), 0, (float)max_selector);

					//bc7enc_vec4F xl, xh;
					vec4F_set_scalar(&xl, 0.0f);
					vec4F_set_scalar(&xh, 0.0f);
					if (pParams->m_has_alpha)
						compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
					else
						compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

					xl = vec4F_mul(&xl, (1.0f / 255.0f));
					xh = vec4F_mul(&xh, (1.0f / 255.0f));

					if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
						return 0;
				}
			}
		}
	}
	
	if (!pParams->m_pForce_selectors)
	{
		// Try encoding the partition as a single color by using the optimal single colors tables to encode the block to its mean.
		if (mode == 1)
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_mode1_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 8) && (pParams->m_num_selector_weights == 8) && (!pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_astc_4bit_3bit_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 7) && (pParams->m_num_selector_weights == 4) && (!pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_astc_range7_2bit_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 8) && (pParams->m_num_selector_weights == 4) && (pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f), a = (int)(.5f + meanColor.m_c[3] * 255.0f);
			uint64_t avg_err = pack_astc_4bit_2bit_to_one_color_rgba(pParams, &avg_results, r, g, b, a, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 13) && (pParams->m_num_selector_weights == 4) && (!pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_astc_range13_2bit_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 11) && (pParams->m_num_selector_weights == 32) && (!pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_astc_range11_5bit_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
	}

#if BC7ENC_CHECK_OVERALL_ERROR
	check_best_overall_error(pParams, pResults);
#endif
		
	return pResults->m_best_overall_err;
}